

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall
helics::FederateState::setProperty(FederateState *this,int timeProperty,Time propertyVal)

{
  long lVar1;
  MessageTimer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined1 auVar2 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int32_t iVar4;
  ActionMessage grantCheck;
  undefined1 local_198 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_190;
  InterfaceHandle local_184;
  uint16_t local_180;
  ActionMessage local_d8;
  
  if (timeProperty < 0x91) {
    if (timeProperty == 0x8f) {
      (this->rt_lag).internalTimeCode = propertyVal.internalTimeCode;
      return;
    }
    if (timeProperty != 0x90) {
LAB_002cd173:
      TimeCoordinator::setProperty
                ((this->timeCoord)._M_t.
                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,timeProperty,
                 propertyVal);
      return;
    }
  }
  else {
    if (timeProperty != 0x91) {
      if (timeProperty == 0xa1) {
        lVar1 = (this->grantTimeOutPeriod).internalTimeCode;
        (this->grantTimeOutPeriod).internalTimeCode = propertyVal.internalTimeCode;
        if (lVar1 == 0) {
          if ((((this->state)._M_i != CREATED) && (0 < (this->grantTimeOutPeriod).internalTimeCode))
             && ((this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr == (element_type *)0x0)) {
            std::
            make_shared<helics::MessageTimer,helics::FederateState::setProperty(int,TimeRepresentation<count_time<9,long>>)::__0>
                      ((anon_class_8_1_8991fb9c *)local_198);
            p_Var3 = p_Stack_190;
            auVar2 = local_198;
            local_198 = (undefined1  [8])0x0;
            p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (this->mTimer).
                      super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)auVar2;
            (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = p_Var3;
            if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
               p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_190);
            }
          }
          if ((this->state)._M_i != EXECUTING) {
            return;
          }
          if (this->timeGranted_mode != false) {
            return;
          }
          ActionMessage::ActionMessage((ActionMessage *)local_198,cmd_grant_timeout_check);
          local_184.hid = this->mGrantCount;
          local_180 = 0;
          if (this->grantTimeoutTimeIndex < 0) {
            lVar1 = (this->grantTimeOutPeriod).internalTimeCode;
            this_00 = (this->mTimer).
                      super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            ActionMessage::ActionMessage(&local_d8,(ActionMessage *)local_198);
            iVar4 = MessageTimer::addTimerFromNow
                              (this_00,(nanoseconds)((lVar1 / 1000000) * 1000000),&local_d8);
            this->grantTimeoutTimeIndex = iVar4;
            ActionMessage::~ActionMessage(&local_d8);
          }
          ActionMessage::~ActionMessage((ActionMessage *)local_198);
          return;
        }
        if (0 < propertyVal.internalTimeCode) {
          return;
        }
        if (this->grantTimeoutTimeIndex < 0) {
          return;
        }
        MessageTimer::cancelTimer
                  ((this->mTimer).
                   super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   this->grantTimeoutTimeIndex);
        return;
      }
      goto LAB_002cd173;
    }
    (this->rt_lag).internalTimeCode = propertyVal.internalTimeCode;
  }
  (this->rt_lead).internalTimeCode = propertyVal.internalTimeCode;
  return;
}

Assistant:

void FederateState::setProperty(int timeProperty, Time propertyVal)
{
    switch (timeProperty) {
        case defs::Properties::RT_LAG:
            rt_lag = propertyVal;
            break;
        case defs::Properties::RT_LEAD:
            rt_lead = propertyVal;
            break;
        case defs::Properties::RT_TOLERANCE:
            rt_lag = propertyVal;
            rt_lead = propertyVal;
            break;
        case defs::Properties::GRANT_TIMEOUT: {
#ifndef HELICS_DISABLE_ASIO
            auto prevTimeout = grantTimeOutPeriod;
            grantTimeOutPeriod = propertyVal;
            if (prevTimeout == timeZero) {
                if (getState() >= FederateStates::INITIALIZING && grantTimeOutPeriod > timeZero) {
                    if (!mTimer) {
                        if (!mTimer) {
                            mTimer = std::make_shared<MessageTimer>([this](ActionMessage&& mess) {
                                return this->addAction(std::move(mess));
                            });
                        }
                    }
                }
                // if we are currently waiting for a grant trigger the timer
                if (getState() == FederateStates::EXECUTING && !timeGranted_mode) {
                    ActionMessage grantCheck(CMD_GRANT_TIMEOUT_CHECK);
                    grantCheck.setExtraData(static_cast<std::int32_t>(mGrantCount));
                    grantCheck.counter = 0;
                    if (grantTimeoutTimeIndex < 0) {
                        grantTimeoutTimeIndex = mTimer->addTimerFromNow(grantTimeOutPeriod.to_ms(),
                                                                        std::move(grantCheck));
                    }
                }
            } else if (grantTimeOutPeriod <= timeZero && grantTimeoutTimeIndex >= 0) {
                mTimer->cancelTimer(grantTimeoutTimeIndex);
            }
#else
            grantTimeOutPeriod = propertyVal;
#endif
        } break;
        default:
            timeCoord->setProperty(timeProperty, propertyVal);
            break;
    }
}